

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

bool __thiscall cmCTestBZR::UpdateImpl(cmCTestBZR *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  string *arg;
  pointer pbVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> bzr_update;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string opts;
  OutputLogger out;
  UpdateParser err;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"UpdateOptions",(allocator<char> *)&out);
  cmCTest::GetCTestConfiguration(&opts,pcVar1,(string *)&err);
  std::__cxx11::string::~string((string *)&err);
  if (opts._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&out,"BZRUpdateOptions",(allocator<char> *)&args);
    cmCTest::GetCTestConfiguration((string *)&err,pcVar1,(string *)&out);
    std::__cxx11::string::operator=((string *)&opts,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&out);
  }
  cmSystemTools::ParseArguments(&args,&opts);
  bzr_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bzr_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bzr_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  err.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&bzr_update,(char **)&err);
  err.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)anon_var_dwarf_2cb4c8;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&bzr_update,(char **)&err);
  for (pbVar3 = args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    err.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)(pbVar3->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&bzr_update,(char **)&err);
  }
  err.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)(this->URL)._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&bzr_update,(char **)&err);
  err.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&bzr_update,(char **)&err);
  cmProcessTools::OutputLogger::OutputLogger
            (&out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-out> ");
  UpdateParser::UpdateParser(&err,this,"pull-err> ");
  bVar2 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,
                     bzr_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&out,
                     (OutputParser *)&err,Auto);
  UpdateParser::~UpdateParser(&err);
  cmProcessTools::LineParser::~LineParser(&out.super_LineParser);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&bzr_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::string::~string((string *)&opts);
  return bVar2;
}

Assistant:

bool cmCTestBZR::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("BZRUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);

  // TODO: if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)

  // Use "bzr pull" to update the working tree.
  std::vector<char const*> bzr_update;
  bzr_update.push_back(this->CommandLineTool.c_str());
  bzr_update.push_back("pull");

  for (std::string const& arg : args) {
    bzr_update.push_back(arg.c_str());
  }

  bzr_update.push_back(this->URL.c_str());

  bzr_update.push_back(nullptr);

  // For some reason bzr uses stderr to display the update status.
  OutputLogger out(this->Log, "pull-out> ");
  UpdateParser err(this, "pull-err> ");
  return this->RunUpdateCommand(bzr_update.data(), &out, &err);
}